

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameterio.cpp
# Opt level: O0

int ReadF0(char *filename,double *temporal_positions,double *f0)

{
  int iVar1;
  int local_4c;
  double dStack_48;
  int i;
  double frame_period;
  undefined1 local_35;
  int number_of_frames;
  FILE *pFStack_30;
  char data_check [5];
  FILE *fp;
  double *f0_local;
  double *temporal_positions_local;
  char *filename_local;
  
  pFStack_30 = fopen(filename,"rb");
  if (pFStack_30 == (FILE *)0x0) {
    printf("File cannot be opened.\n");
    filename_local._4_4_ = 0;
  }
  else {
    iVar1 = anon_unknown.dwarf_a690::CheckHeader((FILE *)pFStack_30,"F0  ");
    if (iVar1 == 0) {
      filename_local._4_4_ = 0;
    }
    else {
      fread(&local_35,1,4,pFStack_30);
      fread((void *)((long)&frame_period + 4),4,1,pFStack_30);
      fread(&local_35,1,4,pFStack_30);
      fread(&stack0xffffffffffffffb8,8,1,pFStack_30);
      fread(f0,8,(long)frame_period._4_4_,pFStack_30);
      fclose(pFStack_30);
      for (local_4c = 0; local_4c < frame_period._4_4_; local_4c = local_4c + 1) {
        temporal_positions[local_4c] = ((double)local_4c / 1000.0) * dStack_48;
      }
      filename_local._4_4_ = 1;
    }
  }
  return filename_local._4_4_;
}

Assistant:

int ReadF0(const char *filename, double *temporal_positions, double *f0) {
  FILE *fp = fopen(filename, "rb");
  if (NULL == fp) {
    printf("File cannot be opened.\n");
    return 0;
  }

  // Header
  if (CheckHeader(fp, "F0  ") == 0) return 0;

  // Parameters
  char data_check[5];
  fread(data_check, 1, 4, fp);  // "NOF "
  int number_of_frames;
  fread(&number_of_frames, 4, 1, fp);

  fread(data_check, 1, 4, fp);  // "FP  "
  double frame_period;
  fread(&frame_period, 8, 1, fp);

  // Data
  fread(f0, 8, number_of_frames, fp);

  fclose(fp);
  for (int i = 0; i < number_of_frames; ++i)
    temporal_positions[i] = i / 1000.0 * frame_period;
  return 1;
}